

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error
adios2_get_by_name(adios2_engine *engine,char *variable_name,void *data,adios2_mode mode)

{
  string *psVar1;
  char *pcVar2;
  Mode MVar3;
  DataType DVar4;
  DataType DVar5;
  DataType DVar6;
  ulong uVar7;
  ulong in_RDX;
  char *in_RSI;
  string *in_RDI;
  string dataStr;
  DataType type;
  Mode modeCpp;
  Engine *engineCpp;
  string *in_stack_fffffffffffffa98;
  allocator *paVar8;
  adios2_mode in_stack_fffffffffffffaa4;
  string *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  DataType local_b8;
  allocator local_b1;
  string local_b0 [32];
  Mode local_90;
  allocator local_89;
  string local_88 [32];
  string *local_68;
  allocator local_49;
  string local_48 [40];
  ulong local_20;
  char *local_18;
  string *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"for adios2_engine, in call to adios2_get_by_name",&local_49);
  adios2::helper::CheckForNullptr<adios2_engine>
            ((adios2_engine *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,"for const char* variable_name, in call to adios2_get_by_name",&local_89);
  adios2::helper::CheckForNullptr<char_const>
            ((char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,
             "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get_by_name"
             ,&local_b1);
  MVar3 = anon_unknown.dwarf_205d4::adios2_ToMode
                    (in_stack_fffffffffffffaa4,in_stack_fffffffffffffa98);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pcVar2 = local_18;
  psVar1 = *(string **)(local_68 + 0x28);
  local_90 = MVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar2,&local_d9);
  DVar4 = adios2::core::IO::InquireVariableType(psVar1);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  if (DVar4 != Struct) {
    local_b8 = DVar4;
    DVar5 = adios2::helper::GetDataType<std::__cxx11::string>();
    DVar6 = local_b8;
    if (DVar4 == DVar5) {
      std::__cxx11::string::string(local_100);
      psVar1 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,local_18,&local_121);
      adios2::core::Engine::Get<std::__cxx11::string>(psVar1,local_120,(Mode)local_100);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      uVar7 = std::__cxx11::string::size();
      std::__cxx11::string::copy((char *)local_100,local_20,uVar7);
      std::__cxx11::string::~string(local_100);
    }
    else {
      DVar5 = adios2::helper::GetDataType<char>();
      psVar1 = local_68;
      DVar4 = local_b8;
      if (DVar6 == DVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,local_18,&local_149);
        adios2::core::Engine::Get<char>(psVar1,(char *)local_148,(Mode)local_20);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
      }
      else {
        DVar5 = adios2::helper::GetDataType<signed_char>();
        psVar1 = local_68;
        DVar6 = local_b8;
        if (DVar4 == DVar5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,local_18,&local_171);
          adios2::core::Engine::Get<signed_char>(psVar1,(signed *)local_170,(Mode)local_20);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
        }
        else {
          DVar5 = adios2::helper::GetDataType<short>();
          psVar1 = local_68;
          DVar4 = local_b8;
          if (DVar6 == DVar5) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_198,local_18,&local_199);
            adios2::core::Engine::Get<short>(psVar1,(short *)local_198,(Mode)local_20);
            std::__cxx11::string::~string(local_198);
            std::allocator<char>::~allocator((allocator<char> *)&local_199);
          }
          else {
            DVar5 = adios2::helper::GetDataType<int>();
            psVar1 = local_68;
            DVar6 = local_b8;
            if (DVar4 == DVar5) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1c0,local_18,&local_1c1);
              adios2::core::Engine::Get<int>(psVar1,(int *)local_1c0,(Mode)local_20);
              std::__cxx11::string::~string(local_1c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
            }
            else {
              DVar5 = adios2::helper::GetDataType<long>();
              psVar1 = local_68;
              DVar4 = local_b8;
              if (DVar6 == DVar5) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1e8,local_18,&local_1e9);
                adios2::core::Engine::Get<long>(psVar1,(long *)local_1e8,(Mode)local_20);
                std::__cxx11::string::~string(local_1e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
              }
              else {
                DVar5 = adios2::helper::GetDataType<unsigned_char>();
                psVar1 = local_68;
                DVar6 = local_b8;
                if (DVar4 == DVar5) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_210,local_18,&local_211);
                  adios2::core::Engine::Get<unsigned_char>(psVar1,(uchar *)local_210,(Mode)local_20)
                  ;
                  std::__cxx11::string::~string(local_210);
                  std::allocator<char>::~allocator((allocator<char> *)&local_211);
                }
                else {
                  DVar5 = adios2::helper::GetDataType<unsigned_short>();
                  psVar1 = local_68;
                  DVar4 = local_b8;
                  if (DVar6 == DVar5) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_238,local_18,&local_239);
                    adios2::core::Engine::Get<unsigned_short>
                              (psVar1,(ushort *)local_238,(Mode)local_20);
                    std::__cxx11::string::~string(local_238);
                    std::allocator<char>::~allocator((allocator<char> *)&local_239);
                  }
                  else {
                    DVar6 = adios2::helper::GetDataType<unsigned_int>();
                    psVar1 = local_68;
                    if (DVar4 == DVar6) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_260,local_18,&local_261);
                      adios2::core::Engine::Get<unsigned_int>
                                (psVar1,(uint *)local_260,(Mode)local_20);
                      std::__cxx11::string::~string(local_260);
                      std::allocator<char>::~allocator((allocator<char> *)&local_261);
                    }
                    else {
                      DVar6 = local_b8;
                      DVar5 = adios2::helper::GetDataType<unsigned_long>();
                      psVar1 = local_68;
                      DVar4 = local_b8;
                      if (DVar6 == DVar5) {
                        paVar8 = &local_289;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_288,local_18,paVar8);
                        adios2::core::Engine::Get<unsigned_long>
                                  (psVar1,(ulong *)local_288,(Mode)local_20);
                        std::__cxx11::string::~string(local_288);
                        std::allocator<char>::~allocator((allocator<char> *)&local_289);
                      }
                      else {
                        DVar5 = adios2::helper::GetDataType<float>();
                        psVar1 = local_68;
                        DVar6 = local_b8;
                        if (DVar4 == DVar5) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_2b0,local_18,&local_2b1);
                          adios2::core::Engine::Get<float>(psVar1,(float *)local_2b0,(Mode)local_20)
                          ;
                          std::__cxx11::string::~string(local_2b0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
                        }
                        else {
                          DVar4 = adios2::helper::GetDataType<double>();
                          psVar1 = local_68;
                          if (DVar6 == DVar4) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_2d8,local_18,&local_2d9);
                            adios2::core::Engine::Get<double>
                                      (psVar1,(double *)local_2d8,(Mode)local_20);
                            std::__cxx11::string::~string(local_2d8);
                            std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
                          }
                          else {
                            DVar6 = local_b8;
                            DVar5 = adios2::helper::GetDataType<long_double>();
                            psVar1 = local_68;
                            DVar4 = local_b8;
                            if (DVar6 == DVar5) {
                              paVar8 = &local_301;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_300,local_18,paVar8);
                              adios2::core::Engine::Get<long_double>
                                        (psVar1,(longdouble *)local_300,(Mode)local_20);
                              std::__cxx11::string::~string(local_300);
                              std::allocator<char>::~allocator((allocator<char> *)&local_301);
                            }
                            else {
                              DVar5 = adios2::helper::GetDataType<std::complex<float>>();
                              psVar1 = local_68;
                              DVar6 = local_b8;
                              if (DVar4 == DVar5) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_328,local_18,&local_329);
                                adios2::core::Engine::Get<std::complex<float>>
                                          (psVar1,(complex *)local_328,(Mode)local_20);
                                std::__cxx11::string::~string(local_328);
                                std::allocator<char>::~allocator((allocator<char> *)&local_329);
                              }
                              else {
                                DVar4 = adios2::helper::GetDataType<std::complex<double>>();
                                psVar1 = local_68;
                                if (DVar6 == DVar4) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_350,local_18,&local_351);
                                  adios2::core::Engine::Get<std::complex<double>>
                                            (psVar1,(complex *)local_350,(Mode)local_20);
                                  std::__cxx11::string::~string(local_350);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_351);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_get_by_name(adios2_engine *engine, const char *variable_name, void *data,
                                const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_get_by_name");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable_name, "for const char* variable_name, in call to "
                                                       "adios2_get_by_name");

        const adios2::Mode modeCpp =
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "
                                "in call to adios2_get_by_name");
        const adios2::DataType type(engineCpp->m_IO.InquireVariableType(variable_name));

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            std::string dataStr;
            engineCpp->Get(variable_name, dataStr);
            dataStr.copy(reinterpret_cast<char *>(data), dataStr.size());
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        engineCpp->Get(variable_name, reinterpret_cast<T *>(data), modeCpp);                       \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get_by_name"));
    }
}